

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O3

auto_ptr<avro::InputStream> __thiscall avro::memoryInputStream(avro *this,OutputStream *source)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  
  lVar5 = __dynamic_cast(source,&OutputStream::typeinfo,&MemoryOutputStream::typeinfo,0);
  if (lVar5 != 0) {
    lVar1 = *(long *)(lVar5 + 0x10);
    lVar2 = *(long *)(lVar5 + 0x18);
    if (lVar1 == lVar2) {
      puVar6 = (undefined8 *)operator_new(0x20);
      *puVar6 = &PTR__InputStream_001813c8;
      puVar6[1] = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
    }
    else {
      puVar6 = (undefined8 *)operator_new(0x38);
      lVar3 = *(long *)(lVar5 + 8);
      lVar4 = *(long *)(lVar5 + 0x28);
      *puVar6 = &PTR__InputStream_00181448;
      puVar6[1] = lVar5 + 0x10;
      puVar6[2] = lVar3;
      puVar6[3] = lVar2 - lVar1 >> 3;
      puVar6[4] = lVar3 - lVar4;
      puVar6[5] = 0;
      puVar6[6] = 0;
    }
    *(undefined8 **)this = puVar6;
    return (auto_ptr<avro::InputStream>)(InputStream *)this;
  }
  __cxa_bad_cast();
}

Assistant:

std::auto_ptr<InputStream> memoryInputStream(const OutputStream& source)
{
    const MemoryOutputStream& mos =
        dynamic_cast<const MemoryOutputStream&>(source);
    return (mos.data_.empty()) ?
        std::auto_ptr<InputStream>(new MemoryInputStream2(0, 0)) :
        std::auto_ptr<InputStream>(new MemoryInputStream(mos.data_,
            mos.chunkSize_,
            (mos.chunkSize_ - mos.available_)));
}